

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getinfo.c
# Opt level: O0

CURLcode Curl_initinfo(Curl_easy *data)

{
  PureInfo *info;
  Progress *pro;
  Curl_easy *data_local;
  
  (data->progress).t_nslookup = 0;
  (data->progress).t_connect = 0;
  (data->progress).t_appconnect = 0;
  (data->progress).t_pretransfer = 0;
  (data->progress).t_starttransfer = 0;
  (data->progress).timespent = 0;
  (data->progress).t_redirect = 0;
  (data->progress).field_0x184 = (data->progress).field_0x184 & 0xfd;
  (data->info).httpcode = 0;
  (data->info).httpproxycode = 0;
  (data->info).httpversion = 0;
  (data->info).filetime = -1;
  (data->info).field_0xec = (data->info).field_0xec & 0xfe;
  (data->info).header_size = 0;
  (data->info).request_size = 0;
  (data->info).proxyauthavail = 0;
  (data->info).httpauthavail = 0;
  (data->info).numconnects = 0;
  (*Curl_cfree)((data->info).contenttype);
  (data->info).contenttype = (char *)0x0;
  (*Curl_cfree)((data->info).wouldredirect);
  (data->info).wouldredirect = (char *)0x0;
  (data->info).conn_primary_ip[0] = '\0';
  (data->info).conn_local_ip[0] = '\0';
  (data->info).conn_primary_port = 0;
  (data->info).conn_local_port = 0;
  (data->info).retry_after = 0;
  (data->info).conn_scheme = (char *)0x0;
  (data->info).conn_protocol = 0;
  Curl_ssl_free_certinfo(data);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_initinfo(struct Curl_easy *data)
{
  struct Progress *pro = &data->progress;
  struct PureInfo *info = &data->info;

  pro->t_nslookup = 0;
  pro->t_connect = 0;
  pro->t_appconnect = 0;
  pro->t_pretransfer = 0;
  pro->t_starttransfer = 0;
  pro->timespent = 0;
  pro->t_redirect = 0;
  pro->is_t_startransfer_set = false;

  info->httpcode = 0;
  info->httpproxycode = 0;
  info->httpversion = 0;
  info->filetime = -1; /* -1 is an illegal time and thus means unknown */
  info->timecond = FALSE;

  info->header_size = 0;
  info->request_size = 0;
  info->proxyauthavail = 0;
  info->httpauthavail = 0;
  info->numconnects = 0;

  free(info->contenttype);
  info->contenttype = NULL;

  free(info->wouldredirect);
  info->wouldredirect = NULL;

  info->conn_primary_ip[0] = '\0';
  info->conn_local_ip[0] = '\0';
  info->conn_primary_port = 0;
  info->conn_local_port = 0;
  info->retry_after = 0;

  info->conn_scheme = 0;
  info->conn_protocol = 0;

#ifdef USE_SSL
  Curl_ssl_free_certinfo(data);
#endif
  return CURLE_OK;
}